

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O2

int fits_hdecompress(uchar *input,int smooth,int *a,int *ny,int *nx,int *scale,int *status)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  LONGLONG LVar8;
  ulong uVar9;
  int *piVar10;
  byte bVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int *piVar20;
  sbyte sVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  uint n;
  long lVar27;
  long lVar28;
  int iVar29;
  long lVar30;
  uint uVar31;
  uint uVar32;
  int iVar33;
  int iVar34;
  uint uVar35;
  int iVar36;
  int iVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  int iVar42;
  ulong uVar43;
  uint uVar44;
  int iVar45;
  int iVar46;
  bool bVar47;
  double dVar48;
  uint local_120;
  int local_118;
  uint local_110;
  ulong local_108;
  int local_f4;
  int local_f0;
  uint local_d8;
  int local_c4;
  int local_c0;
  
  if (0 < *status) {
    return *status;
  }
  nextchar = 2;
  if (*(char (*) [2])input == code_magic) {
    iVar4 = readint(input);
    *nx = iVar4;
    iVar4 = readint(input);
    *ny = iVar4;
    iVar4 = readint(input);
    *scale = iVar4;
    LVar8 = readlonglong(input);
    bVar11 = input[nextchar];
    bVar12 = input[nextchar + 1];
    bVar1 = input[nextchar + 2];
    nextchar = nextchar + 3;
    iVar4 = *nx;
    iVar2 = *ny;
    uVar9 = 0;
    uVar43 = (ulong)(uint)(iVar2 * iVar4);
    if (iVar2 * iVar4 < 1) {
      uVar43 = uVar9;
    }
    for (; uVar43 != uVar9; uVar9 = uVar9 + 1) {
      a[uVar9] = 0;
    }
    iVar17 = (iVar4 + 1) / 2;
    iVar5 = (iVar2 + 1) / 2;
    bits_to_go = 0;
    iVar6 = qtree_decode(input,a,iVar2,iVar17,iVar5,(uint)bVar11);
    if (iVar6 == 0) {
      iVar6 = qtree_decode(input,a + iVar5,iVar2,iVar17,iVar2 / 2,(uint)bVar12);
      if (iVar6 == 0) {
        iVar6 = qtree_decode(input,a + iVar17 * iVar2,iVar2,iVar4 / 2,iVar5,(uint)bVar12);
        if ((iVar6 == 0) &&
           (iVar6 = qtree_decode(input,a + (iVar17 * iVar2 + iVar5),iVar2,iVar4 / 2,iVar2 / 2,
                                 (uint)bVar1), iVar6 == 0)) {
          iVar4 = input_nybble(input);
          if (iVar4 == 0) {
            bits_to_go = 0;
            for (uVar9 = 0; uVar43 != uVar9; uVar9 = uVar9 + 1) {
              if ((a[uVar9] != 0) && (iVar4 = input_bit(input), iVar4 != 0)) {
                a[uVar9] = -a[uVar9];
              }
            }
            *a = (int)LVar8;
            *status = 0;
            iVar4 = *scale;
            local_f0 = *nx;
            iVar2 = *ny;
            if (1 < iVar4) {
              for (piVar10 = a; piVar10 <= a + (long)(local_f0 * iVar2) + -1; piVar10 = piVar10 + 1)
              {
                *piVar10 = *piVar10 * iVar4;
              }
              local_f0 = *nx;
              iVar2 = *ny;
              iVar4 = *scale;
            }
            iVar5 = iVar2;
            if (iVar2 < local_f0) {
              iVar5 = local_f0;
            }
            dVar48 = log((double)iVar5);
            piVar10 = (int *)malloc((long)((iVar5 + 1) / 2) << 2);
            if (piVar10 == (int *)0x0) {
              ffpmsg("hinv: insufficient memory");
              iVar6 = 0x19e;
            }
            else {
              iVar6 = (int)(dVar48 / 0.6931471805599453 + 0.5);
              sVar21 = 1;
              bVar11 = (byte)iVar6;
              bVar47 = 1 << (bVar11 & 0x1f) < iVar5;
              local_c4 = (uint)bVar47 + iVar6 + -1;
              bVar12 = (byte)local_c4;
              uVar13 = 1 << (bVar12 & 0x1f);
              local_110 = 2 << (bVar12 & 0x1f);
              uVar18 = (int)local_110 >> 1;
              local_118 = 1 << (bVar11 + bVar47 & 0x1f);
              *a = (*a >> 0x1f) + *a + ((4 << (bVar12 & 0x1f)) >> 1) & uVar13 * -4;
              uVar40 = iVar4 >> 1;
              iVar4 = iVar2 * 2;
              uVar41 = -uVar40;
              lVar30 = (long)iVar4;
              local_108 = 1;
              n = 1;
              uVar23 = uVar13;
              uVar38 = -uVar13;
              local_120 = uVar18 - 1;
              local_f4 = iVar2;
              local_d8 = uVar13 * -2;
              while (uVar22 = uVar38, uVar14 = uVar23, -1 < local_c4) {
                uVar13 = (int)uVar13 >> 1;
                local_118 = local_118 >> 1;
                n = n * 2 - (uint)(local_f0 <= local_118);
                uVar23 = (int)local_108 * 2 - (uint)(local_f4 <= local_118);
                local_108 = (ulong)uVar23;
                uVar43 = 0;
                piVar20 = a;
                if (0 < (int)n) {
                  uVar43 = (ulong)n;
                }
                while (bVar47 = uVar43 != 0, uVar43 = uVar43 - 1, bVar47) {
                  unshuffle(piVar20,uVar23,1,piVar10);
                  piVar20 = piVar20 + iVar2;
                }
                iVar5 = local_118;
                if (local_f4 <= local_118) {
                  iVar5 = 0;
                }
                uVar7 = uVar13 - 1;
                piVar20 = a;
                uVar43 = 0;
                if (0 < (int)uVar23) {
                  uVar43 = local_108;
                }
                while (uVar43 != 0) {
                  unshuffle(piVar20,n,iVar2,piVar10);
                  piVar20 = piVar20 + 1;
                  uVar43 = uVar43 - 1;
                }
                iVar6 = local_118;
                if (local_f0 <= local_118) {
                  iVar6 = 0;
                }
                bVar47 = local_c4 == 0;
                local_c4 = local_c4 + -1;
                iVar17 = 2;
                if (bVar47) {
                  sVar21 = 2;
                  uVar7 = 0;
                }
                if (0 < (int)uVar40 && smooth != 0) {
                  iVar36 = iVar2 * 3;
                  iVar45 = iVar4;
                  for (; iVar17 < (int)(n - 2); iVar17 = iVar17 + 2) {
                    lVar27 = (long)iVar45;
                    for (lVar16 = 0; (int)lVar16 < (int)uVar23; lVar16 = lVar16 + 2) {
                      uVar31 = a[lVar30 + lVar27 + lVar16] - a[lVar27 + lVar16];
                      uVar39 = a[lVar27 + lVar16] - a[lVar27 + (lVar16 - lVar30)];
                      uVar38 = uVar39;
                      if ((int)uVar31 < (int)uVar39) {
                        uVar38 = uVar31;
                      }
                      if ((int)uVar39 < (int)uVar31) {
                        uVar39 = uVar31;
                      }
                      if ((int)uVar38 < 1) {
                        uVar38 = 0;
                      }
                      iVar33 = uVar38 * 4;
                      iVar42 = ((int)uVar39 >> 0x1f & uVar39) * 4;
                      if (SBORROW4(iVar42,iVar33) != (int)(iVar42 + uVar38 * -4) < 0) {
                        iVar19 = a[lVar30 + lVar27 + lVar16] - a[lVar27 + (lVar16 - lVar30)];
                        if (SBORROW4(iVar19,iVar33) != (int)(iVar19 + uVar38 * -4) < 0) {
                          iVar33 = iVar19;
                        }
                        if (iVar19 <= iVar42) {
                          iVar33 = iVar42;
                        }
                        uVar39 = iVar33 + a[iVar36 + lVar16] * -8;
                        uVar38 = (int)(uVar39 + 7) >> 3;
                        if (-1 < (int)uVar39) {
                          uVar38 = uVar39 >> 3;
                        }
                        if ((int)uVar40 <= (int)uVar38) {
                          uVar38 = uVar40;
                        }
                        if ((int)uVar38 <= (int)uVar41) {
                          uVar38 = uVar41;
                        }
                        a[iVar36 + lVar16] = uVar38 + a[iVar36 + lVar16];
                      }
                    }
                    iVar45 = iVar45 + iVar4;
                    iVar36 = iVar36 + iVar4;
                  }
                  iVar36 = 2;
                  for (iVar17 = 0; iVar33 = 2, iVar45 = iVar2 * 3 + 2, local_c0 = iVar2 * 2 + 2,
                      iVar17 < (int)n; iVar17 = iVar17 + 2) {
                    for (lVar27 = 2; (int)lVar27 < (int)(uVar23 - 2); lVar27 = lVar27 + 2) {
                      uVar31 = a[iVar36 + lVar27] - a[(long)iVar36 + lVar27 + -2];
                      uVar39 = a[(long)iVar36 + lVar27 + -2] - a[(long)iVar36 + lVar27 + -4];
                      uVar38 = uVar39;
                      if ((int)uVar31 < (int)uVar39) {
                        uVar38 = uVar31;
                      }
                      if ((int)uVar39 < (int)uVar31) {
                        uVar39 = uVar31;
                      }
                      if ((int)uVar38 < 1) {
                        uVar38 = 0;
                      }
                      iVar45 = uVar38 * 4;
                      iVar33 = ((int)uVar39 >> 0x1f & uVar39) * 4;
                      if (SBORROW4(iVar33,iVar45) != (int)(iVar33 + uVar38 * -4) < 0) {
                        iVar42 = a[iVar36 + lVar27] - a[(long)iVar36 + lVar27 + -4];
                        if (SBORROW4(iVar42,iVar45) != (int)(iVar42 + uVar38 * -4) < 0) {
                          iVar45 = iVar42;
                        }
                        if (iVar42 <= iVar33) {
                          iVar45 = iVar33;
                        }
                        uVar39 = iVar45 + a[(long)iVar36 + lVar27 + -1] * -8;
                        uVar38 = (int)(uVar39 + 7) >> 3;
                        if (-1 < (int)uVar39) {
                          uVar38 = uVar39 >> 3;
                        }
                        if ((int)uVar40 <= (int)uVar38) {
                          uVar38 = uVar40;
                        }
                        if ((int)uVar38 <= (int)uVar41) {
                          uVar38 = uVar41;
                        }
                        a[(long)iVar36 + lVar27 + -1] = uVar38 + a[(long)iVar36 + lVar27 + -1];
                      }
                    }
                    iVar36 = iVar36 + iVar4;
                  }
                  for (; iVar33 < (int)(n - 2); iVar33 = iVar33 + 2) {
                    lVar27 = (long)local_c0;
                    for (lVar16 = 0; (int)lVar16 + 2 < (int)(uVar23 - 2); lVar16 = lVar16 + 2) {
                      iVar42 = a[iVar45 + lVar16];
                      iVar19 = a[lVar27 + lVar16];
                      iVar24 = a[lVar30 + lVar27 + lVar16 + 2] - iVar19;
                      iVar34 = iVar19 - a[lVar30 + lVar27 + lVar16 + -2];
                      iVar36 = a[(lVar27 + lVar16 + -2) - lVar30] - iVar19;
                      iVar19 = iVar19 - a[(lVar27 + lVar16 + 2) - lVar30];
                      iVar17 = 0;
                      if (0 < iVar36) {
                        iVar17 = iVar36;
                      }
                      if (-1 < iVar36) {
                        iVar36 = 0;
                      }
                      iVar37 = 0;
                      if (0 < iVar19) {
                        iVar37 = iVar19;
                      }
                      if (-1 < iVar19) {
                        iVar19 = 0;
                      }
                      iVar46 = 0;
                      if (0 < iVar34) {
                        iVar46 = iVar34;
                      }
                      if (-1 < iVar34) {
                        iVar34 = 0;
                      }
                      iVar15 = 0;
                      if (0 < iVar24) {
                        iVar15 = iVar24;
                      }
                      iVar3 = a[lVar27 + lVar16 + 1];
                      if (-1 < iVar24) {
                        iVar24 = 0;
                      }
                      iVar29 = iVar42 * 2 + iVar3 * 2;
                      iVar15 = iVar15 - iVar29;
                      iVar46 = iVar46 + iVar42 * 2 + iVar3 * -2;
                      if (iVar15 < iVar46) {
                        iVar46 = iVar15;
                      }
                      iVar17 = iVar17 + iVar42 * 2;
                      iVar37 = iVar37 + iVar42 * -2;
                      if (iVar17 <= iVar37) {
                        iVar37 = iVar17;
                      }
                      iVar37 = iVar37 + iVar3 * 2;
                      if (iVar37 <= iVar46) {
                        iVar46 = iVar37;
                      }
                      iVar24 = iVar24 - iVar29;
                      iVar17 = iVar34 + iVar42 * 2 + iVar3 * -2;
                      iVar34 = iVar46 * 0x10;
                      if (iVar17 < iVar24) {
                        iVar17 = iVar24;
                      }
                      iVar19 = iVar19 + iVar42 * -2;
                      iVar36 = iVar36 + iVar42 * 2;
                      if (iVar19 <= iVar36) {
                        iVar19 = iVar36;
                      }
                      iVar19 = iVar19 + iVar3 * 2;
                      if (iVar17 <= iVar19) {
                        iVar17 = iVar19;
                      }
                      iVar36 = iVar17 * 0x10;
                      if (SBORROW4(iVar36,iVar34) != iVar36 + iVar46 * -0x10 < 0) {
                        iVar42 = (a[(lVar27 + lVar16 + -2) - lVar30] -
                                 (a[lVar30 + lVar27 + lVar16 + -2] +
                                 a[(lVar27 + lVar16 + 2) - lVar30])) +
                                 a[lVar30 + lVar27 + lVar16 + 2];
                        if (SBORROW4(iVar42,iVar34) != iVar42 + iVar46 * -0x10 < 0) {
                          iVar34 = iVar42;
                        }
                        if (iVar42 == iVar36 ||
                            SBORROW4(iVar42,iVar36) != iVar42 + iVar17 * -0x10 < 0) {
                          iVar34 = iVar36;
                        }
                        uVar39 = iVar34 + a[(long)iVar45 + lVar16 + 1] * -0x40;
                        uVar38 = (int)(uVar39 + 0x3f) >> 6;
                        if (-1 < (int)uVar39) {
                          uVar38 = uVar39 >> 6;
                        }
                        if ((int)uVar40 <= (int)uVar38) {
                          uVar38 = uVar40;
                        }
                        if ((int)uVar38 <= (int)uVar41) {
                          uVar38 = uVar41;
                        }
                        a[(long)iVar45 + lVar16 + 1] = uVar38 + a[(long)iVar45 + lVar16 + 1];
                      }
                    }
                    iVar45 = iVar45 + iVar4;
                    local_c0 = local_c0 + iVar4;
                  }
                }
                local_f4 = local_f4 - iVar5;
                local_f0 = local_f0 - iVar6;
                iVar6 = (int)uVar23 % 2;
                iVar17 = 0;
                iVar5 = iVar2;
                for (iVar36 = 0; lVar27 = (long)iVar17, iVar36 < (int)(n - (int)n % 2);
                    iVar36 = iVar36 + 2) {
                  lVar28 = lVar27 << 0x20;
                  lVar25 = (long)iVar5;
                  lVar26 = lVar25 << 0x20;
                  for (lVar16 = 0; (int)lVar16 < (int)(uVar23 - iVar6); lVar16 = lVar16 + 2) {
                    uVar38 = uVar18;
                    if (a[lVar25 + lVar16] < 0) {
                      uVar38 = local_120;
                    }
                    uVar39 = uVar38 + a[lVar25 + lVar16] & local_d8;
                    uVar38 = uVar18;
                    if (a[lVar27 + lVar16 + 1] < 0) {
                      uVar38 = local_120;
                    }
                    uVar31 = uVar38 + a[lVar27 + lVar16 + 1] & local_d8;
                    uVar38 = uVar13;
                    if (a[lVar25 + lVar16 + 1] < 0) {
                      uVar38 = uVar7;
                    }
                    uVar35 = uVar38 + a[lVar25 + lVar16 + 1] & uVar22;
                    uVar44 = uVar35 & uVar14;
                    uVar38 = -uVar44;
                    if ((int)uVar39 < 0) {
                      uVar38 = uVar44;
                    }
                    uVar38 = uVar38 + uVar39;
                    iVar45 = a[lVar27 + lVar16];
                    uVar39 = -uVar44;
                    if ((int)uVar31 < 0) {
                      uVar39 = uVar44;
                    }
                    uVar39 = uVar39 + uVar31;
                    uVar31 = (uVar38 ^ uVar35 ^ uVar39) & local_110;
                    if (iVar45 < 0) {
                      uVar32 = uVar44 - uVar31;
                      if (uVar44 == 0) {
                        uVar32 = uVar31;
                      }
                      iVar45 = uVar32 + iVar45;
                    }
                    else {
                      iVar45 = (uVar44 + iVar45) - uVar31;
                    }
                    a[lVar25 + lVar16 + 1] = (int)(iVar45 + uVar38 + uVar39 + uVar35) >> sVar21;
                    a[lVar25 + lVar16] = (int)((iVar45 + uVar38) - (uVar39 + uVar35)) >> sVar21;
                    a[lVar27 + lVar16 + 1] = (int)((uVar39 - uVar35) + (iVar45 - uVar38)) >> sVar21;
                    a[lVar27 + lVar16] = (int)((uVar35 - uVar39) + (iVar45 - uVar38)) >> sVar21;
                    lVar28 = lVar28 + 0x200000000;
                    lVar26 = lVar26 + 0x200000000;
                  }
                  if (iVar6 != 0) {
                    iVar45 = *(int *)((long)a + (lVar26 >> 0x1e));
                    uVar38 = uVar18;
                    if (iVar45 < 0) {
                      uVar38 = local_120;
                    }
                    iVar33 = *(int *)((long)a + (lVar28 >> 0x1e));
                    uVar39 = uVar38 + iVar45 & local_d8;
                    uVar38 = -(uVar39 & local_110);
                    if (iVar33 < 0) {
                      uVar38 = uVar39 & local_110;
                    }
                    iVar33 = uVar38 + iVar33;
                    *(int *)((long)a + (lVar26 >> 0x1e)) = (int)(iVar33 + uVar39) >> sVar21;
                    *(int *)((long)a + (lVar28 >> 0x1e)) = (int)(iVar33 - uVar39) >> sVar21;
                  }
                  iVar5 = iVar5 + iVar4;
                  iVar17 = iVar17 + iVar4;
                }
                if ((int)n % 2 != 0) {
                  lVar25 = lVar27 << 0x20;
                  for (lVar16 = 0; (int)lVar16 < (int)(uVar23 - iVar6); lVar16 = lVar16 + 2) {
                    uVar38 = uVar18;
                    if (a[lVar27 + lVar16 + 1] < 0) {
                      uVar38 = local_120;
                    }
                    uVar39 = uVar38 + a[lVar27 + lVar16 + 1] & local_d8;
                    uVar38 = -(uVar39 & local_110);
                    if (a[lVar27 + lVar16] < 0) {
                      uVar38 = uVar39 & local_110;
                    }
                    iVar5 = uVar38 + a[lVar27 + lVar16];
                    a[lVar27 + lVar16 + 1] = (int)(iVar5 + uVar39) >> sVar21;
                    a[lVar27 + lVar16] = (int)(iVar5 - uVar39) >> sVar21;
                    lVar25 = lVar25 + 0x200000000;
                  }
                  if (iVar6 != 0) {
                    piVar20 = (int *)((long)a + (lVar25 >> 0x1e));
                    *piVar20 = *piVar20 >> sVar21;
                  }
                }
                uVar23 = (int)uVar14 >> 1;
                uVar38 = (int)uVar22 >> 1;
                local_120 = uVar7;
                local_110 = uVar14;
                local_d8 = uVar22;
                uVar18 = uVar13;
              }
              free(piVar10);
              iVar6 = 0;
            }
            goto LAB_001c6696;
          }
          ffpmsg("dodecode: bad bit plane values");
          iVar6 = 0x19e;
        }
      }
    }
    *a = (int)LVar8;
  }
  else {
    ffpmsg("bad file format");
    iVar6 = 0x19e;
  }
LAB_001c6696:
  *status = iVar6;
  return iVar6;
}

Assistant:

int fits_hdecompress(unsigned char *input, int smooth, int *a, int *ny, int *nx, 
                     int *scale, int *status)
{
  /* 
     decompress the input byte stream using the H-compress algorithm
  
   input  - input array of compressed bytes
   a - pre-allocated array to hold the output uncompressed image
   nx - returned X axis size
   ny - returned Y axis size

 NOTE: the nx and ny dimensions as defined within this code are reversed from
 the usual FITS notation.  ny is the fastest varying dimension, which is
 usually considered the X axis in the FITS image display

  */
int stat;

  if (*status > 0) return(*status);

	/* decode the input array */

        FFLOCK;  /* decode uses the nextchar global variable */
	stat = decode(input, a, nx, ny, scale);
        FFUNLOCK;

        *status = stat;
	if (stat) return(*status);
	
	/*
	 * Un-Digitize
	 */
	undigitize(a, *nx, *ny, *scale);

	/*
	 * Inverse H-transform
	 */
	stat = hinv(a, *nx, *ny, smooth, *scale);
        *status = stat;
	
  return(*status);
}